

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_psbt.cpp
# Opt level: O0

void cfd::js::api::GetPsbtFromString(string *psbt_string,string *caller,Psbt *psbt)

{
  ulong uVar1;
  CfdException *this;
  string err_msg;
  CfdException *fail_base64;
  undefined1 local_6d;
  allocator local_59;
  string local_58 [32];
  CfdSourceLocation local_38;
  Psbt *local_20;
  Psbt *psbt_local;
  string *caller_local;
  string *psbt_string_local;
  
  local_20 = psbt;
  psbt_local = (Psbt *)caller;
  caller_local = psbt_string;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    cfd::Psbt::Psbt((Psbt *)&fail_base64,(string *)caller_local);
    cfd::Psbt::operator=(local_20,(Psbt *)&fail_base64);
    Psbt::~Psbt((Psbt *)&fail_base64);
    return;
  }
  local_38.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/src/cfdjs_psbt.cpp"
               ,0x2f);
  local_38.filename = local_38.filename + 1;
  local_38.line = 0x47;
  local_38.funcname = "GetPsbtFromString";
  core::logger::warn<std::__cxx11::string_const&>
            (&local_38,"Failed to {}. empty psbt.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psbt_local);
  local_6d = 1;
  this = (CfdException *)__cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"Invalid hex string. empty data.",&local_59);
  core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_58);
  local_6d = 0;
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

static void GetPsbtFromString(
    const std::string& psbt_string, const std::string& caller, Psbt* psbt) {
  if (psbt_string.empty()) {
    warn(CFD_LOG_SOURCE, "Failed to {}. empty psbt.", caller);
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid hex string. empty data.");
  }

  try {
    *psbt = Psbt(psbt_string);
  } catch (const CfdException& fail_base64) {
    std::string err_msg(fail_base64.what());
    if (err_msg != "psbt unmatch magic error.") {
      throw fail_base64;
    }
    *psbt = Psbt(ByteData(psbt_string));
  }
}